

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_echocli.cpp
# Opt level: O0

void SetAddr(char *pszIP,unsigned_short shPort,sockaddr_in *addr)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t local_24;
  int nIP;
  sockaddr_in *addr_local;
  unsigned_short shPort_local;
  char *pszIP_local;
  
  memset(addr,0,0x10);
  addr->sin_family = 2;
  uVar1 = htons(shPort);
  addr->sin_port = uVar1;
  if ((pszIP != (char *)0x0) && (*pszIP != '\0')) {
    iVar2 = strcmp(pszIP,"0");
    if (iVar2 != 0) {
      iVar2 = strcmp(pszIP,"0.0.0.0");
      if (iVar2 != 0) {
        iVar2 = strcmp(pszIP,"*");
        if (iVar2 != 0) {
          local_24 = inet_addr(pszIP);
          goto LAB_00105bdf;
        }
      }
    }
  }
  local_24 = htonl(0);
LAB_00105bdf:
  (addr->sin_addr).s_addr = local_24;
  return;
}

Assistant:

static void SetAddr(const char *pszIP,const unsigned short shPort,struct sockaddr_in &addr)
{
	bzero(&addr,sizeof(addr));
	addr.sin_family = AF_INET;
	addr.sin_port = htons(shPort);
	int nIP = 0;
	if( !pszIP || '\0' == *pszIP   
			|| 0 == strcmp(pszIP,"0") || 0 == strcmp(pszIP,"0.0.0.0") 
			|| 0 == strcmp(pszIP,"*") 
	  )
	{
		nIP = htonl(INADDR_ANY);
	}
	else
	{
		nIP = inet_addr(pszIP);
	}
	addr.sin_addr.s_addr = nIP;

}